

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O1

bool __thiscall wasm::IString::startsWith<7>(IString *this,char (*str) [7])

{
  int iVar1;
  size_t __n;
  bool bVar2;
  
  __n = strlen(*str);
  if ((this->str)._M_len < __n) {
    bVar2 = false;
  }
  else if (__n == 0) {
    bVar2 = true;
  }
  else {
    iVar1 = bcmp((this->str)._M_str,str,__n);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool startsWith(const char (&str)[N]) {
    return startsWith(std::string_view(str));
  }